

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O3

void __thiscall dg::llvmdg::legacy::Function::~Function(Function *this)

{
  void *pvVar1;
  void *pvVar2;
  _Rb_tree_node_base *p_Var3;
  
  for (p_Var3 = (this->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->blocks)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pvVar1 = *(void **)(p_Var3 + 1);
    if (pvVar1 != (void *)0x0) {
      std::
      _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
      ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                  *)((long)pvVar1 + 0xe8),*(_Link_type *)((long)pvVar1 + 0xf8));
      std::
      _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
      ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                  *)((long)pvVar1 + 0xb8),*(_Link_type *)((long)pvVar1 + 200));
      std::
      _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
      ::_M_erase((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>,_std::_Select1st<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
                  *)((long)pvVar1 + 0x88),*(_Link_type *)((long)pvVar1 + 0x98));
      std::
      _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
      ::_M_erase((_Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                  *)((long)pvVar1 + 0x50),*(_Link_type *)((long)pvVar1 + 0x60));
      std::
      _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
      ::_M_erase((_Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                  *)((long)pvVar1 + 0x20),*(_Link_type *)((long)pvVar1 + 0x30));
      pvVar2 = *(void **)((long)pvVar1 + 8);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)((long)pvVar1 + 0x18) - (long)pvVar2);
      }
    }
    operator_delete(pvVar1,0x118);
  }
  std::
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::_M_erase(&(this->blocks)._M_t,
             (_Link_type)(this->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

Function::~Function() {
    for (auto *block : blocks) {
        delete block;
    }
}